

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

int cPow(int x,int n)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (0 < n) {
    uVar5 = n - 1;
    auVar9 = _DAT_0010a400;
    iVar1 = 4;
    do {
      auVar6 = auVar9;
      auVar9._0_4_ = auVar6._0_4_ * x;
      auVar7._8_4_ = (undefined4)((auVar6._8_8_ & 0xffffffff) * (ulong)(uint)x);
      auVar7._4_4_ = auVar7._8_4_;
      auVar7._0_4_ = auVar9._0_4_;
      auVar7._12_4_ = auVar6._12_4_ * x;
      auVar9._8_8_ = auVar7._8_8_;
      auVar9._4_4_ = auVar6._4_4_ * x;
      iVar2 = iVar1 + -4;
      iVar4 = iVar1 + (n + 3U & 0xfffffffc);
      iVar1 = iVar2;
    } while (iVar4 != 8);
    uVar3 = -iVar2;
    auVar8._0_4_ = -(uint)((int)(uVar5 ^ 0x80000000) < (int)(uVar3 ^ 0x80000000));
    auVar8._4_4_ = -(uint)((int)(uVar5 ^ 0x80000000) < (int)((uVar3 | 1) ^ 0x80000000));
    auVar8._8_4_ = -(uint)((int)(uVar5 ^ 0x80000000) < (int)((uVar3 | 2) ^ 0x80000000));
    auVar8._12_4_ = -(uint)((int)(uVar5 ^ 0x80000000) < (int)((uVar3 | 3) ^ 0x80000000));
    auVar9 = ~auVar8 & auVar9 | auVar6 & auVar8;
    return auVar9._8_4_ * auVar9._0_4_ * auVar9._4_4_ * auVar9._12_4_;
  }
  return 1;
}

Assistant:

procedure 
int cPow(int x, int n) {
	variable int i; variable int r;
	r = 1; i = 0;
	while (i < n) {
		r = r * x;
		i = i + 1;
	}
	return r;
}